

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_benchmark.c
# Opt level: O3

int main(void)

{
  __time_t _Var1;
  roaring_bitmap_t *r;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  timespec ts;
  timespec local_28;
  
  clock_gettime(3,&local_28);
  lVar2 = local_28.tv_nsec;
  _Var1 = local_28.tv_sec;
  lVar3 = 1000000;
  do {
    r = roaring_bitmap_create_with_capacity(0);
    roaring_bitmap_free(r);
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  clock_gettime(3,&local_28);
  lVar2 = (local_28.tv_sec - _Var1) * 1000000000 + (local_28.tv_nsec - lVar2);
  auVar4._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar4._0_8_ = lVar2;
  auVar4._12_4_ = 0x45300000;
  printf("%f cycles per object created \n",
         ((auVar4._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) / 1000000.0);
  return 0;
}

Assistant:

int main() {
    size_t N = 1000000;
    uint64_t cycles_start, cycles_final;

    RDTSC_START(cycles_start);
    for (size_t i = 0; i < N; i++) {
        roaring_bitmap_t* bm = roaring_bitmap_create();
        roaring_bitmap_free(bm);
    }
    RDTSC_FINAL(cycles_final);
    printf("%f cycles per object created \n",
           (cycles_final - cycles_start) * 1.0 / N);
    return 0;
}